

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::PerfEvents_RawEvent::PerfEvents_RawEvent(PerfEvents_RawEvent *this)

{
  PerfEvents_RawEvent *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__PerfEvents_RawEvent_009c0e70
  ;
  this->type_ = 0;
  this->config_ = 0;
  this->config1_ = 0;
  this->config2_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<5UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

PerfEvents_RawEvent::PerfEvents_RawEvent() = default;